

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merl.cpp
# Opt level: O0

void configureViewerProgram(void)

{
  (*glad_glProgramUniform1i)(g_gl.programs[0],g_gl.uniforms[0],1);
  (*glad_glProgramUniform1f)(g_gl.programs[0],g_gl.uniforms[1],g_app.viewer.exposure);
  (*glad_glProgramUniform1f)(g_gl.programs[0],g_gl.uniforms[2],g_app.viewer.gamma);
  return;
}

Assistant:

void configureViewerProgram()
{
    glProgramUniform1i(g_gl.programs[PROGRAM_VIEWER],
                       g_gl.uniforms[UNIFORM_VIEWER_FRAMEBUFFER_SAMPLER],
                       TEXTURE_SCENE);
    glProgramUniform1f(g_gl.programs[PROGRAM_VIEWER],
                       g_gl.uniforms[UNIFORM_VIEWER_EXPOSURE],
                       g_app.viewer.exposure);
    glProgramUniform1f(g_gl.programs[PROGRAM_VIEWER],
                       g_gl.uniforms[UNIFORM_VIEWER_GAMMA],
                       g_app.viewer.gamma);
}